

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O0

void __thiscall Snes_Spc::cpu_write_smp_reg_(Snes_Spc *this,int data,rel_time_t time,int addr)

{
  Spc_Dsp *pSVar1;
  int iVar2;
  uint uVar3;
  Timer *pTVar4;
  int in_ECX;
  uint in_ESI;
  long in_RDI;
  int enabled;
  Timer *t_1;
  int i;
  int period;
  Timer *t;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  Snes_Spc *in_stack_ffffffffffffffd0;
  int local_28;
  
  switch(in_ECX) {
  case 0:
    break;
  case 1:
    if ((in_ESI & 0x10) != 0) {
      *(undefined1 *)(in_RDI + 0x85c) = 0;
      *(undefined1 *)(in_RDI + 0x85d) = 0;
    }
    if ((in_ESI & 0x20) != 0) {
      *(undefined1 *)(in_RDI + 0x85e) = 0;
      *(undefined1 *)(in_RDI + 0x85f) = 0;
    }
    for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
      in_stack_ffffffffffffffd0 = (Snes_Spc *)(in_RDI + 0x800 + (long)local_28 * 0x18);
      uVar3 = (int)in_ESI >> ((byte)local_28 & 0x1f);
      in_stack_ffffffffffffffcc = uVar3 & 1;
      if (*(uint *)((in_stack_ffffffffffffffd0->dsp).m.regs + 0x10) != in_stack_ffffffffffffffcc) {
        in_stack_ffffffffffffffd0 =
             (Snes_Spc *)
             run_timer(in_stack_ffffffffffffffd0,
                       (Timer *)(CONCAT44(uVar3,in_stack_ffffffffffffffc8) & 0x1ffffffff),0);
        *(uint *)((in_stack_ffffffffffffffd0->dsp).m.regs + 0x10) = in_stack_ffffffffffffffcc;
        if (in_stack_ffffffffffffffcc != 0) {
          pSVar1 = &in_stack_ffffffffffffffd0->dsp;
          (pSVar1->m).regs[0xc] = '\0';
          (pSVar1->m).regs[0xd] = '\0';
          (pSVar1->m).regs[0xe] = '\0';
          (pSVar1->m).regs[0xf] = '\0';
          pSVar1 = &in_stack_ffffffffffffffd0->dsp;
          (pSVar1->m).regs[0x14] = '\0';
          (pSVar1->m).regs[0x15] = '\0';
          (pSVar1->m).regs[0x16] = '\0';
          (pSVar1->m).regs[0x17] = '\0';
        }
      }
    }
    enable_rom(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    break;
  case 8:
  case 9:
    *(char *)(in_RDI + 0x858 + (long)in_ECX) = (char)in_ESI;
    break;
  case 10:
  case 0xb:
  case 0xc:
    iVar2 = (in_ESI - 1 & 0xff) + 1;
    if (*(int *)(in_RDI + (long)(in_ECX + -10) * 0x18 + 0x808) != iVar2) {
      pTVar4 = run_timer(in_stack_ffffffffffffffd0,
                         (Timer *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
      pTVar4->period = iVar2;
    }
    break;
  case 0xd:
  case 0xe:
  case 0xf:
    if ((int)in_ESI < 0x1000) {
      pTVar4 = run_timer(in_stack_ffffffffffffffd0,
                         (Timer *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
      pTVar4->counter = 0;
    }
  }
  return;
}

Assistant:

void Snes_Spc::cpu_write_smp_reg_( int data, rel_time_t time, int addr )
{
	switch ( addr )
	{
	case r_t0target:
	case r_t1target:
	case r_t2target: {
		Timer* t = &m.timers [addr - r_t0target];
		int period = IF_0_THEN_256( data );
		if ( t->period != period )
		{
			t = run_timer( t, time );
			#if SPC_MORE_ACCURACY
				// Insane behavior when target is written just after counter is
				// clocked and counter matches new period and new period isn't 1, 2, 4, or 8
				if ( t->divider == (period & 0xFF) &&
						t->next_time == time + TIMER_MUL( t, 1 ) &&
						((period - 1) | ~0x0F) & period )
				{
					//debug_printf( "SPC pathological timer target write\n" );
					
					// If the period is 3, 5, or 9, there's a probability this behavior won't occur,
					// based on the previous period
					int prob = 0xFF;
					int old_period = t->period & 0xFF;
					if ( period == 3 ) prob = glitch_probs [0] [old_period];
					if ( period == 5 ) prob = glitch_probs [1] [old_period];
					if ( period == 9 ) prob = glitch_probs [2] [old_period];
					
					// The glitch suppresses incrementing of one of the counter bits, based on
					// the lowest set bit in the new period
					int b = 1;
					while ( !(period & b) )
						b <<= 1;
					
					if ( (rand() >> 4 & 0xFF) <= prob )
						t->divider = (t->divider - b) & 0xFF;
				}
			#endif
			t->period = period;
		}
		break;
	}
	
	case r_t0out:
	case r_t1out:
	case r_t2out:
		if ( !SPC_MORE_ACCURACY )
			debug_printf( "SPC wrote to counter %d\n", (int) addr - r_t0out );
		
		if ( data < no_read_before_write  / 2 )
			run_timer( &m.timers [addr - r_t0out], time - 1 )->counter = 0;
		break;
	
	// Registers that act like RAM
	case 0x8:
	case 0x9:
		REGS_IN [addr] = (uint8_t) data;
		break;
	
	case r_test:
		if ( (uint8_t) data != 0x0A )
			debug_printf( "SPC wrote to test register\n" );
		break;
	
	case r_control:
		// port clears
		if ( data & 0x10 )
		{
			REGS_IN [r_cpuio0] = 0;
			REGS_IN [r_cpuio1] = 0;
		}
		if ( data & 0x20 )
		{
			REGS_IN [r_cpuio2] = 0;
			REGS_IN [r_cpuio3] = 0;
		}
		
		// timers
		{
			for ( int i = 0; i < timer_count; i++ )
			{
				Timer* t = &m.timers [i];
				int enabled = data >> i & 1;
				if ( t->enabled != enabled )
				{
					t = run_timer( t, time );
					t->enabled = enabled;
					if ( enabled )
					{
						t->divider = 0;
						t->counter = 0;
					}
				}
			}
		}
		enable_rom( data & 0x80 );
		break;
	}
}